

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchy.c
# Opt level: O1

ecs_entity_t find_as_alias(ecs_world_t *world,char *name)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  long lVar4;
  
  uVar1 = ecs_vector_count(world->aliases);
  pvVar3 = _ecs_vector_first(world->aliases,0x10,0x10);
  if (0 < (int)uVar1) {
    lVar4 = 0;
    do {
      iVar2 = strcmp(*(char **)((long)pvVar3 + lVar4),name);
      if (iVar2 == 0) {
        return *(ecs_entity_t *)((long)pvVar3 + lVar4 + 8);
      }
      lVar4 = lVar4 + 0x10;
    } while ((ulong)uVar1 << 4 != lVar4);
  }
  return 0;
}

Assistant:

static
ecs_entity_t find_as_alias(
    ecs_world_t *world,
    const char *name)
{
    int32_t i, count = ecs_vector_count(world->aliases);
    ecs_alias_t *aliases = ecs_vector_first(world->aliases, ecs_alias_t);
    for (i = 0; i < count; i ++) {
        if (!strcmp(aliases[i].name, name)) {
            return aliases[i].entity;
        }
    }

    return 0;
}